

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

void __thiscall
glslang::TSymbolValidater::operator()
          (TSymbolValidater *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          *entKey)

{
  EShLanguage language;
  TIntermSymbol *pTVar1;
  long lVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar9;
  undefined4 extraout_var_03;
  long lVar10;
  long *plVar11;
  _Base_ptr p_Var12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TType *pTVar13;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TType *pTVar14;
  TQualifier *pTVar15;
  TType *pTVar16;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  TTypeList *pTVar17;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  ulong uVar18;
  bool *pbVar19;
  TVarLiveMap *pTVar20;
  size_type sVar21;
  EShLanguage language_00;
  ulong uVar22;
  char *__lhs;
  uint uVar23;
  long lVar24;
  EShLanguage language_01;
  _Self __tmp;
  iterator iVar25;
  TString mangleName2;
  TString mangleName1;
  TType subType;
  TString err_4;
  TString local_148;
  long local_120;
  TString local_118;
  undefined1 local_f0 [16];
  undefined1 local_e0 [136];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  pTVar1 = (entKey->second).symbol;
  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar1);
  pTVar13 = (TType *)CONCAT44(extraout_var,iVar7);
  local_118._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_148._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  language = (entKey->second).stage;
  language_00 = language;
  uVar18 = (ulong)language;
  do {
    uVar18 = uVar18 - 1;
    if ((int)language_00 < 1) {
      language_00 = EShLangCount;
      break;
    }
    language_00 = language_00 - EShLangTessControl;
  } while (this->inVarMaps[uVar18 & 0xffffffff] == (TVarLiveMap *)0x0);
  uVar18 = 0xd;
  if (0xd < (int)language) {
    uVar18 = (ulong)language;
  }
  lVar10 = 0;
  do {
    if (uVar18 - (long)(int)language == lVar10) {
      language_01 = EShLangCount;
      goto LAB_003f2c63;
    }
    lVar24 = lVar10 + 1;
    lVar2 = lVar10 + 1;
    lVar10 = lVar24;
  } while (this->inVarMaps[(int)language + lVar2] == (TVarLiveMap *)0x0);
  language_01 = (int)lVar24 + language;
LAB_003f2c63:
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  iVar7 = (*pTVar13->_vptr_TType[0xb])(pTVar13);
  bVar5 = TQualifier::isArrayedIo((TQualifier *)CONCAT44(extraout_var_00,iVar7),language);
  if (bVar5) {
    TType::TType((TType *)local_f0,pTVar13,0,false);
    TType::buildMangledName((TType *)local_f0,&local_118);
  }
  else {
    TType::buildMangledName(pTVar13,&local_118);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  push_back(&local_118,';');
  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar1);
  if ((*(uint *)(CONCAT44(extraout_var_01,iVar7) + 8) & 0x7f) == 3) {
    if (language_00 == EShLangCount) {
      return;
    }
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(pTVar1);
    if (CONCAT44(extraout_var_02,iVar7) < 0x300000000000000) {
      return;
    }
    if (&this->outVarMaps[language_00]->_M_t ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         *)0x0) {
      return;
    }
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
            ::find(&this->outVarMaps[language_00]->_M_t,&entKey->first);
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar1);
    lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x58))
                       ((long *)CONCAT44(extraout_var_03,iVar7));
    pTVar20 = this->outVarMaps[language_00];
    if ((((_Rb_tree_header *)iVar9._M_node == &(pTVar20->_M_t)._M_impl.super__Rb_tree_header) &&
        (uVar23 = *(uint *)(lVar10 + 0x1c) & 0xfff, uVar23 != 0xfff)) &&
       (p_Var12 = (pTVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       p_Var12 != iVar9._M_node)) {
      do {
        plVar11 = (long *)(**(code **)(*(long *)p_Var12[2]._M_left + 0xf0))();
        lVar10 = (**(code **)(*plVar11 + 0x58))(plVar11);
        iVar25._M_node = p_Var12;
        if ((*(uint *)(lVar10 + 0x1c) & 0xfff) == uVar23) break;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        iVar25 = iVar9;
      } while (p_Var12 != iVar9._M_node);
      pTVar20 = this->outVarMaps[language_00];
      iVar9._M_node = iVar25._M_node;
    }
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar1);
    pTVar13 = (TType *)CONCAT44(extraout_var_14,iVar7);
    if ((_Rb_tree_header *)iVar9._M_node == &(pTVar20->_M_t)._M_impl.super__Rb_tree_header) {
      iVar7 = (*pTVar13->_vptr_TType[0x29])(pTVar13);
      if ((char)iVar7 != '\0') {
        return;
      }
      if (this->profile != EEsProfile) {
        return;
      }
      if ((entKey->second).live != true) {
        return;
      }
      *this->hadError = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     local_f0,&entKey->first,
                     ": not been declare as a output variable in pre shader stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,(char *)local_f0._8_8_);
      return;
    }
    pTVar14 = (TType *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
    if (*this->hadError == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f0,(entKey->first)._M_dataplus._M_p,(allocator<char> *)&local_58);
      bVar5 = typeCheck(this,pTVar13,pTVar14,(string *)local_f0,false);
      *this->hadError = bVar5;
      if ((TPoolAllocator *)local_f0._0_8_ != (TPoolAllocator *)local_e0) {
        operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
      }
    }
    else {
      *this->hadError = true;
    }
    plVar11 = (long *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
    pTVar15 = (TQualifier *)(**(code **)(*plVar11 + 0x58))(plVar11);
    bVar5 = TQualifier::isArrayedIo(pTVar15,language_00);
    if (bVar5) {
      pTVar16 = (TType *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
      TType::TType((TType *)local_f0,pTVar16,0,false);
      TType::buildMangledName((TType *)local_f0,&local_148);
    }
    else {
      pTVar16 = (TType *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
      TType::buildMangledName(pTVar16,&local_148);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    push_back(&local_148,';');
    sVar4 = local_118._M_string_length;
    sVar3 = local_148._M_string_length;
    sVar21 = local_118._M_string_length;
    if (local_148._M_string_length < local_118._M_string_length) {
      sVar21 = local_148._M_string_length;
    }
    if (sVar21 == 0) {
      if (local_118._M_string_length != local_148._M_string_length) goto LAB_003f3576;
    }
    else {
      iVar7 = bcmp(local_118._M_dataplus._M_p,local_148._M_dataplus._M_p,sVar21);
      if ((sVar4 != sVar3) || (iVar7 != 0)) {
LAB_003f3576:
        iVar7 = (*pTVar13->_vptr_TType[7])(pTVar13);
        if ((iVar7 == 0x10) &&
           ((iVar7 = (*pTVar13->_vptr_TType[0x25])(pTVar13), (char)iVar7 != '\0' &&
            (iVar7 = (*pTVar14->_vptr_TType[0x25])(pTVar14), (char)iVar7 == '\0')))) {
          local_f0._0_8_ = GetThreadPoolAllocator();
          local_e0._0_8_ = (char *)0x0;
          local_e0[8] = '\0';
          local_f0._8_8_ = local_e0 + 8;
          pTVar17 = TType::getStruct(pTVar13);
          TType::buildMangledName
                    (((pTVar17->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_start)->type,
                     (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     local_f0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_f0,';');
          iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)local_f0,&local_148);
          if (iVar7 == 0) {
            iVar7 = (*pTVar13->_vptr_TType[0xb])(pTVar13);
            uVar23 = *(uint *)(CONCAT44(extraout_var_19,iVar7) + 0x1c);
            iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
            if (((uVar23 ^ *(uint *)(CONCAT44(extraout_var_20,iVar7) + 0x1c)) & 0xfff) == 0) {
              return;
            }
          }
        }
        iVar7 = (*pTVar14->_vptr_TType[7])(pTVar14);
        if (((iVar7 == 0x10) &&
            (iVar7 = (*pTVar14->_vptr_TType[0x25])(pTVar14), (char)iVar7 != '\0')) &&
           (iVar7 = (*pTVar13->_vptr_TType[0x25])(pTVar13), (char)iVar7 == '\0')) {
          local_f0._0_8_ = GetThreadPoolAllocator();
          local_e0._0_8_ = (char *)0x0;
          local_e0[8] = '\0';
          local_f0._8_8_ = local_e0 + 8;
          pTVar17 = TType::getStruct(pTVar14);
          TType::buildMangledName
                    (((pTVar17->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_start)->type,
                     (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     local_f0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_f0,';');
          iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)local_f0,&local_118);
          if (iVar7 == 0) {
            iVar7 = (*pTVar13->_vptr_TType[0xb])(pTVar13);
            uVar23 = *(uint *)(CONCAT44(extraout_var_21,iVar7) + 0x1c);
            iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
            uVar23 = (uVar23 ^ *(uint *)(CONCAT44(extraout_var_22,iVar7) + 0x1c)) & 0xfff;
            goto joined_r0x003f3726;
          }
        }
        goto LAB_003f3728;
      }
    }
    if (this->profile != EEsProfile) {
      return;
    }
    if (this->version != 300) {
      return;
    }
    if ((entKey->second).stage != EShLangFragment) {
      return;
    }
    iVar7 = (*pTVar13->_vptr_TType[0x29])(pTVar13);
    if ((char)iVar7 != '\0') {
      return;
    }
    iVar7 = (*pTVar13->_vptr_TType[0xb])(pTVar13);
    iVar7 = *(int *)(CONCAT44(extraout_var_15,iVar7) + 8);
    iVar8 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
    if (iVar7 < 0 != ((*(byte *)(CONCAT44(extraout_var_16,iVar8) + 0xb) & 0x80) == 0)) {
      iVar7 = (*pTVar13->_vptr_TType[0xb])(pTVar13);
      uVar18 = *(ulong *)(CONCAT44(extraout_var_17,iVar7) + 8);
      iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
      if (((uVar18 ^ *(ulong *)(CONCAT44(extraout_var_18,iVar7) + 8)) >> 0x25 & 1) == 0) {
        return;
      }
    }
    __lhs = "Interpolation qualifier mismatch : ";
  }
  else {
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar1);
    if ((*(uint *)(CONCAT44(extraout_var_04,iVar7) + 8) & 0x7f) != 4) {
      iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar1);
      if (1 < (*(uint *)(CONCAT44(extraout_var_06,iVar7) + 8) & 0x7f) - 5) {
        return;
      }
      iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar1);
      if (*(char *)(CONCAT44(extraout_var_07,iVar7) + 0x2d) != '\0') {
        return;
      }
      uVar18 = 0;
      do {
        if ((uVar18 != language) && (this->outVarMaps[uVar18] != (TVarLiveMap *)0x0)) {
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                  ::find(&this->uniformVarMap[uVar18]->_M_t,&entKey->first);
          if ((_Rb_tree_header *)iVar9._M_node ==
              &(this->uniformVarMap[uVar18]->_M_t)._M_impl.super__Rb_tree_header) {
            iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])
                              (pTVar1);
            if (iVar7 == 0x10) {
              iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                                (pTVar1);
              iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_08,iVar7),0,5,"anon@");
              if (iVar7 == 0) {
                iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar1);
                plVar11 = (long *)CONCAT44(extraout_var_09,iVar7);
                cVar6 = (**(code **)(*plVar11 + 0x128))(plVar11);
                if (cVar6 == '\0') {
                  __assert_fail("isStruct()",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
                }
                local_120 = plVar11[0xd];
                lVar10 = *(long *)(local_120 + 8);
                if (*(long *)(local_120 + 0x10) != lVar10) {
                  lVar24 = 0;
                  uVar22 = 0;
                  do {
                    lVar10 = (**(code **)(**(long **)(lVar10 + lVar24) + 0x30))();
                    local_f0._0_8_ = GetThreadPoolAllocator();
                    local_f0._8_8_ = local_e0 + 8;
                    std::__cxx11::
                    basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                         *)local_f0,*(long *)(lVar10 + 8),
                                        *(long *)(lVar10 + 0x10) + *(long *)(lVar10 + 8));
                    iVar9 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                            ::find(&this->uniformVarMap[uVar18]->_M_t,(key_type *)local_f0);
                    if ((_Rb_tree_header *)iVar9._M_node !=
                        &(this->uniformVarMap[uVar18]->_M_t)._M_impl.super__Rb_tree_header) {
                      std::operator+(&local_58,"Invalid Uniform variable name : ",
                                     (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)local_f0);
                      TInfoSinkBase::message
                                (&this->infoSink->info,EPrefixInternalError,
                                 local_58._M_dataplus._M_p);
                      *this->hadError = true;
                      break;
                    }
                    uVar22 = uVar22 + 1;
                    lVar10 = *(long *)(local_120 + 8);
                    lVar24 = lVar24 + 0x20;
                  } while (uVar22 < (ulong)(*(long *)(local_120 + 0x10) - lVar10 >> 5));
                }
              }
            }
          }
          else {
            pTVar14 = (TType *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
            TType::buildMangledName(pTVar14,&local_148);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::push_back(&local_148,';');
            sVar4 = local_118._M_string_length;
            sVar3 = local_148._M_string_length;
            sVar21 = local_118._M_string_length;
            if (local_148._M_string_length < local_118._M_string_length) {
              sVar21 = local_148._M_string_length;
            }
            if (sVar21 == 0) {
              if (local_118._M_string_length != local_148._M_string_length) goto LAB_003f3093;
            }
            else {
              iVar7 = bcmp(local_118._M_dataplus._M_p,local_148._M_dataplus._M_p,sVar21);
              if ((sVar4 != sVar3) || (iVar7 != 0)) {
LAB_003f3093:
                pTVar14 = (TType *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
                if (pTVar13->field_0x8 == pTVar14->field_0x8) {
                  TType::sameElementShape(pTVar14,pTVar13,(int *)0x0,(int *)0x0);
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                *)local_f0,"Invalid Uniform variable type : ",&entKey->first);
                TInfoSinkBase::message
                          (&this->infoSink->info,EPrefixInternalError,(char *)local_f0._8_8_);
                *this->hadError = true;
              }
            }
            local_148._M_string_length = 0;
            *local_148._M_dataplus._M_p = '\0';
            if (*this->hadError == false) {
              iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (pTVar1);
              iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar7) + 0x38))
                                ((long *)CONCAT44(extraout_var_10,iVar7));
              if (iVar7 == 0x10) {
                iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                                  (pTVar1);
                iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_11,iVar7),0,5,"anon@");
                this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 400))();
                iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(this_00,0,5,"anon@");
                if ((iVar7 == 0) != (iVar8 == 0)) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)local_f0,
                                 "Matched uniform block names must also either all be lacking an instance name or all having an instance name: "
                                 ,&entKey->first);
                  TInfoSinkBase::message
                            (&this->infoSink->info,EPrefixInternalError,(char *)local_f0._8_8_);
                  *this->hadError = true;
                }
              }
            }
            iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar1);
            pTVar14 = (TType *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
            pbVar19 = this->hadError;
            if (*pbVar19 == false) {
              iVar8 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (pTVar1);
              iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar8) + 0x38))
                                ((long *)CONCAT44(extraout_var_13,iVar8));
              pbVar19 = this->hadError;
              if (iVar8 == 0x10) {
                if ((*pbVar19 & 1U) == 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_f0,(entKey->first)._M_dataplus._M_p,
                             (allocator<char> *)&local_58);
                  bVar5 = true;
LAB_003f3289:
                  bVar5 = typeCheck(this,(TType *)CONCAT44(extraout_var_12,iVar7),pTVar14,
                                    (string *)local_f0,bVar5);
                  *this->hadError = bVar5;
                  if ((TPoolAllocator *)local_f0._0_8_ != (TPoolAllocator *)local_e0) {
                    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
                  }
                  goto LAB_003f31e8;
                }
              }
              else if ((*pbVar19 & 1U) == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_f0,(entKey->first)._M_dataplus._M_p,
                           (allocator<char> *)&local_58);
                bVar5 = false;
                goto LAB_003f3289;
              }
            }
            *pbVar19 = true;
          }
        }
LAB_003f31e8:
        uVar18 = uVar18 + 1;
        if (uVar18 == 0xe) {
          return;
        }
      } while( true );
    }
    if (language_01 == EShLangCount) {
      return;
    }
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(pTVar1);
    if (CONCAT44(extraout_var_05,iVar7) < 0x300000000000000) {
      return;
    }
    if (&this->inVarMaps[language_01]->_M_t ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         *)0x0) {
      return;
    }
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
            ::find(&this->inVarMaps[language_01]->_M_t,&entKey->first);
    if ((_Rb_tree_header *)iVar9._M_node ==
        &(this->inVarMaps[language_01]->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    plVar11 = (long *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
    pTVar15 = (TQualifier *)(**(code **)(*plVar11 + 0x58))(plVar11);
    bVar5 = TQualifier::isArrayedIo(pTVar15,language_01);
    if (bVar5) {
      pTVar13 = (TType *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
      TType::TType((TType *)local_f0,pTVar13,0,false);
      TType::buildMangledName((TType *)local_f0,&local_148);
    }
    else {
      pTVar13 = (TType *)(**(code **)(*(long *)iVar9._M_node[2]._M_left + 0xf0))();
      TType::buildMangledName(pTVar13,&local_148);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    push_back(&local_148,';');
    uVar23 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                       (&local_118,&local_148);
joined_r0x003f3726:
    if (uVar23 == 0) {
      return;
    }
LAB_003f3728:
    __lhs = "Invalid In/Out variable type : ";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_f0,__lhs,&entKey->first);
  TInfoSinkBase::message(&this->infoSink->info,EPrefixInternalError,(char *)local_f0._8_8_);
  *this->hadError = true;
  return;
}

Assistant:

inline void operator()(std::pair<const TString, TVarEntryInfo>& entKey) {
        TVarEntryInfo& ent1 = entKey.second;
        TIntermSymbol* base = ent1.symbol;
        const TType& type = ent1.symbol->getType();
        const TString& name = entKey.first;
        TString mangleName1, mangleName2;
        EShLanguage stage = ent1.stage;
        EShLanguage preStage, currentStage, nextStage;

        preStage = EShLangCount;
        for (int i = stage - 1; i >= 0; i--) {
            if (inVarMaps[i] != nullptr) {
                preStage = static_cast<EShLanguage>(i);
                break;
            }
        }
        currentStage = stage;
        nextStage = EShLangCount;
        for (int i = stage + 1; i < EShLangCount; i++) {
            if (inVarMaps[i] != nullptr) {
                nextStage = static_cast<EShLanguage>(i);
                break;
            }
        }

        if (type.getQualifier().isArrayedIo(stage)) {
            TType subType(type, 0);
            subType.appendMangledName(mangleName1);
        } else {
            type.appendMangledName(mangleName1);
        }


        // basic checking that symbols match
        // more extensive checking in the link stage
        if (base->getQualifier().storage == EvqVaryingIn) {
            // validate stage in;
            if (preStage == EShLangCount)
                return;
            if (TSymbolTable::isBuiltInSymbol(base->getId()))
                return;
            if (outVarMaps[preStage] != nullptr) {
                auto ent2 = outVarMaps[preStage]->find(name);
                uint32_t location = base->getType().getQualifier().layoutLocation;
                if (ent2 == outVarMaps[preStage]->end() &&
                    location != glslang::TQualifier::layoutLocationEnd) {
                    for (auto var = outVarMaps[preStage]->begin(); var != ent2; var++) {
                        if (var->second.symbol->getType().getQualifier().layoutLocation == location) {
                            ent2 = var;
                            break;
                        }
                    }
                }
                if (ent2 != outVarMaps[preStage]->end()) {
                    auto& type1 = base->getType();
                    auto& type2 = ent2->second.symbol->getType();
                    hadError = hadError || typeCheck(&type1, &type2, name.c_str(), false);
                    if (ent2->second.symbol->getType().getQualifier().isArrayedIo(preStage)) {
                        TType subType(ent2->second.symbol->getType(), 0);
                        subType.appendMangledName(mangleName2);
                    } else {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                    }

                    if (mangleName1 == mangleName2) {
                        // For ES 3.0 only, other versions have no such restrictions
                        // According to ES 3.0 spec: The type and presence of the interpolation qualifiers and
                        // storage qualifiers  of variables with the same name declared in all linked shaders must
                        // match, otherwise the link command will fail.
                        if (profile == EEsProfile && version == 300) {
                            // Don't need to check smooth qualifier, as it uses the default interpolation mode
                            if (ent1.stage == EShLangFragment && type1.isBuiltIn() == false) {
                                if (type1.getQualifier().flat != type2.getQualifier().flat ||
                                    type1.getQualifier().nopersp != type2.getQualifier().nopersp) {
                                    TString err = "Interpolation qualifier mismatch : " + entKey.first;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                }
                            }
                        }
                        return;
                    }
                    else {
                        // Deal with input/output pairs where one is a block member but the other is loose,
                        // e.g. with ARB_separate_shader_objects
                        if (type1.getBasicType() == EbtBlock &&
                            type1.isStruct() && !type2.isStruct()) {
                            // Iterate through block members tracking layout
                            glslang::TString name;
                            type1.getStruct()->begin()->type->appendMangledName(name);
                            if (name == mangleName2
                                && type1.getQualifier().layoutLocation == type2.getQualifier().layoutLocation) return;
                        }
                        if (type2.getBasicType() == EbtBlock &&
                            type2.isStruct() && !type1.isStruct()) {
                            // Iterate through block members tracking layout
                            glslang::TString name;
                            type2.getStruct()->begin()->type->appendMangledName(name);
                            if (name == mangleName1
                                && type1.getQualifier().layoutLocation == type2.getQualifier().layoutLocation) return;
                        }
                        TString err = "Invalid In/Out variable type : " + entKey.first;
                        infoSink.info.message(EPrefixInternalError, err.c_str());
                        hadError = true;
                    }
                }
                else if (!base->getType().isBuiltIn()) {
                    // According to spec: A link error is generated if any statically referenced input variable
                    // or block does not have a matching output
                    if (profile == EEsProfile && ent1.live) {
                        hadError = true;
                        TString errorStr = name + ": not been declare as a output variable in pre shader stage.";
                        infoSink.info.message(EPrefixError, errorStr.c_str());
                    }
                }
                return;
            }
        } else if (base->getQualifier().storage == EvqVaryingOut) {
            // validate stage out;
            if (nextStage == EShLangCount)
                return;
            if (TSymbolTable::isBuiltInSymbol(base->getId()))
                return;
            if (inVarMaps[nextStage] != nullptr) {
                auto ent2 = inVarMaps[nextStage]->find(name);
                if (ent2 != inVarMaps[nextStage]->end()) {
                    if (ent2->second.symbol->getType().getQualifier().isArrayedIo(nextStage)) {
                        TType subType(ent2->second.symbol->getType(), 0);
                        subType.appendMangledName(mangleName2);
                    } else {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                    }
                    if (mangleName1 == mangleName2)
                        return;
                    else {
                        TString err = "Invalid In/Out variable type : " + entKey.first;
                        infoSink.info.message(EPrefixInternalError, err.c_str());
                        hadError = true;
                    }
                }
                return;
            }
        } else if (base->getQualifier().isUniformOrBuffer() && !base->getQualifier().isPushConstant()) {
            // validate uniform type;
            for (int i = 0; i < EShLangCount; i++) {
                if (i != currentStage && outVarMaps[i] != nullptr) {
                    auto ent2 = uniformVarMap[i]->find(name);
                    if (ent2 != uniformVarMap[i]->end()) {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                        if (mangleName1 != mangleName2) {
                            ent2->second.symbol->getType().sameElementType(type);
                            TString err = "Invalid Uniform variable type : " + entKey.first;
                            infoSink.info.message(EPrefixInternalError, err.c_str());
                            hadError = true;
                        }
                        mangleName2.clear();

                        // validate instance name of blocks
                        if (hadError == false &&
                            base->getType().getBasicType() == EbtBlock &&
                            IsAnonymous(base->getName()) != IsAnonymous(ent2->second.symbol->getName())) {
                            TString err = "Matched uniform block names must also either all be lacking "
                                          "an instance name or all having an instance name: " + entKey.first;
                            infoSink.info.message(EPrefixInternalError, err.c_str());
                            hadError = true;
                        }

                        // validate uniform block member qualifier and member names
                        auto& type1 = base->getType();
                        auto& type2 = ent2->second.symbol->getType();
                        if (hadError == false && base->getType().getBasicType() == EbtBlock) {
                            hadError = hadError || typeCheck(&type1, &type2, name.c_str(), true);
                        }
                        else {
                            hadError = hadError || typeCheck(&type1, &type2, name.c_str(), false);
                        }
                    }
                    else if (base->getBasicType() == EbtBlock)
                    {
                        if (IsAnonymous(base->getName()))
                        {
                            // The name of anonymous block member can't same with default uniform variable.
                            auto blockType1 = base->getType().getStruct();
                            for (size_t memberIdx = 0; memberIdx < blockType1->size(); ++memberIdx) {
                                auto memberName = (*blockType1)[memberIdx].type->getFieldName();
                                if (uniformVarMap[i]->find(memberName) != uniformVarMap[i]->end())
                                {
                                    TString err = "Invalid Uniform variable name : " + memberName;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                    break;
                                }
                            }
                        }
                    }
                }
            }
        }
    }